

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_3::CreateContextExtCase::deinit(CreateContextExtCase *this)

{
  Library *pLVar1;
  CreateContextExtCase *this_local;
  
  std::vector<int,_std::allocator<int>_>::clear(&this->m_attribList);
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_configs);
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar1->_vptr_Library[0x34])(pLVar1,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void CreateContextExtCase::deinit (void)
{
	m_attribList.clear();
	m_configs.clear();

	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}